

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

void __thiscall
adios2::helper::CommImplDummy::Gather
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t recvcount,Datatype recvtype,int root,string *param_9)

{
  size_t sVar1;
  long in_RDX;
  void *in_RSI;
  void *in_R8;
  long in_R9;
  int in_stack_00000010;
  size_t nrecv;
  size_t nsent;
  allocator local_e9;
  string local_e8 [32];
  size_t local_c8;
  size_t local_c0;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string *in_stack_ffffffffffffffb0;
  
  if ((in_RDX == 0) || (in_RSI != (void *)0x0)) {
    if ((in_R9 == 0) || (in_R8 != (void *)0x0)) {
      if (in_stack_00000010 == 0) {
        sVar1 = CommImpl::SizeOf(SignedChar);
        local_c0 = in_RDX * sVar1;
        sVar1 = CommImpl::SizeOf(SignedChar);
        local_c8 = in_R9 * sVar1;
        if (local_c8 == local_c0) {
          memcpy(in_R8,in_RSI,local_c0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"send and recv sizes differ",&local_e9);
          anon_unknown_8::CommDummyError(in_stack_ffffffffffffffb0);
          std::__cxx11::string::~string(local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,"root is not 0",&local_b1);
        anon_unknown_8::CommDummyError(in_stack_ffffffffffffffb0);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"recvbuf is null",&local_89);
      anon_unknown_8::CommDummyError(in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,"sendbuf is null",&local_51);
    anon_unknown_8::CommDummyError(in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void CommImplDummy::Gather(const void *sendbuf, size_t sendcount, Datatype sendtype, void *recvbuf,
                           size_t recvcount, Datatype recvtype, int root, const std::string &) const
{
    if (sendcount > 0 && !sendbuf)
    {
        return CommDummyError("sendbuf is null");
    }
    if (recvcount > 0 && !recvbuf)
    {
        return CommDummyError("recvbuf is null");
    }
    if (root != 0)
    {
        return CommDummyError("root is not 0");
    }

    const size_t nsent = sendcount * CommImpl::SizeOf(sendtype);
    const size_t nrecv = recvcount * CommImpl::SizeOf(recvtype);

    if (nrecv != nsent)
    {
        return CommDummyError("send and recv sizes differ");
    }

    std::memcpy(recvbuf, sendbuf, nsent);
}